

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void process_file(path *file,vector<IncludePath,_std::allocator<IncludePath>_> *include_paths,
                 map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
                 *headers,ProcessResult *result)

{
  long lVar1;
  pointer pcVar2;
  pointer pCVar3;
  int iVar4;
  ostream *poVar5;
  istream *piVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  ulong uVar8;
  long *plVar9;
  long *plVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  IncludeStmt current;
  string fixed_path_with_quotes;
  string path_with_quotes;
  string line;
  string path;
  string behind_path;
  string prefix_system;
  vector<Candidate,_std::allocator<Candidate>_> candidate_fixes;
  string prefix_user;
  string prefix_all;
  Candidate fix;
  stringstream buffer;
  ifstream in;
  IncludeStmt local_758;
  char *local_730;
  long local_728;
  char local_720;
  undefined7 uStack_71f;
  char *local_710;
  long local_708;
  char local_700;
  undefined7 uStack_6ff;
  char *local_6f0;
  long local_6e8;
  char local_6e0;
  undefined7 uStack_6df;
  path *local_6d0;
  long *local_6c8;
  long local_6c0;
  long local_6b8;
  long lStack_6b0;
  undefined1 *local_6a8;
  size_t local_6a0;
  undefined1 local_698;
  undefined7 uStack_697;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  char *local_668;
  long local_660;
  char local_658;
  undefined7 uStack_657;
  long *local_648;
  ulong local_640;
  long local_638 [2];
  vector<Candidate,_std::allocator<Candidate>_> local_628;
  long *local_610;
  ulong local_608;
  long local_600 [2];
  long *local_5f0 [2];
  long local_5e0 [2];
  vector<IncludePath,_std::allocator<IncludePath>_> *local_5d0;
  map<IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::less<IncludePath>,_std::allocator<std::pair<const_IncludePath,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>_>_>
  *local_5c8;
  undefined1 local_5c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  char local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  undefined8 local_570;
  ios_base local_4c8 [264];
  stringstream local_3c0 [16];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  long *local_238;
  long local_230;
  long local_228 [63];
  
  local_5d0 = include_paths;
  local_5c8 = headers;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    Process ",0xc);
  pcVar2 = (file->_M_pathname)._M_dataplus._M_p;
  local_6d0 = file;
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,pcVar2,pcVar2 + (file->_M_pathname)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_238,local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ...",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  std::__cxx11::stringstream::stringstream(local_3c0);
  pcVar2 = (local_6d0->_M_pathname)._M_dataplus._M_p;
  local_5c0._0_8_ = &local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c0,pcVar2,pcVar2 + (local_6d0->_M_pathname)._M_string_length);
  std::ifstream::ifstream(&local_238,(string *)local_5c0,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._0_8_ != &local_5b0) {
    operator_delete((void *)local_5c0._0_8_,local_5b0._M_allocated_capacity + 1);
  }
  local_6f0 = &local_6e0;
  local_6e8 = 0;
  local_6e0 = '\0';
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_238,(string *)&local_6f0,'\n');
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      if (dry_run == false) {
        pcVar2 = (local_6d0->_M_pathname)._M_dataplus._M_p;
        local_758.path._M_dataplus._M_p = (pointer)&local_758.path.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_758,pcVar2,pcVar2 + (local_6d0->_M_pathname)._M_string_length);
        std::ofstream::ofstream(local_5c0,(string *)&local_758,_S_out);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758.path._M_dataplus._M_p != &local_758.path.field_2) {
          operator_delete(local_758.path._M_dataplus._M_p,
                          local_758.path.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5c0,local_758.path._M_dataplus._M_p,
                   local_758.path._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758.path._M_dataplus._M_p != &local_758.path.field_2) {
          operator_delete(local_758.path._M_dataplus._M_p,
                          local_758.path.field_2._M_allocated_capacity + 1);
        }
        std::ofstream::close();
        local_5c0._0_8_ = _VTT;
        *(undefined8 *)(local_5c0 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_split_cmpts;
        std::filebuf::~filebuf((filebuf *)(local_5c0 + 8));
        std::ios_base::~ios_base(local_4c8);
      }
      if (local_6f0 != &local_6e0) {
        operator_delete(local_6f0,CONCAT71(uStack_6df,local_6e0) + 1);
      }
      std::ifstream::~ifstream(&local_238);
      std::__cxx11::stringstream::~stringstream(local_3c0);
      std::ios_base::~ios_base(local_340);
      return;
    }
    local_5f0[0] = local_5e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"#include ","");
    local_648 = local_638;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"#include <","");
    local_610 = local_600;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"#include \"","");
    plVar10 = local_610;
    if (local_608 != 0 && local_6e8 != 0) {
      lVar13 = 0;
      do {
        if (local_6f0[lVar13] != *(char *)((long)local_610 + lVar13)) goto LAB_001099b6;
        lVar1 = lVar13 + 1;
      } while ((local_6e8 + -1 != lVar13) &&
              (bVar14 = local_608 - 1 != lVar13, lVar13 = lVar1, bVar14));
      plVar10 = (long *)(lVar1 + (long)local_610);
    }
    if (plVar10 == (long *)((long)local_610 + local_608)) {
LAB_00109a24:
      result->total = result->total + 1;
      local_6a8 = &local_698;
      local_6a0 = 0;
      local_698 = 0;
      local_668 = &local_658;
      local_660 = 0;
      local_658 = '\0';
      local_710 = &local_700;
      local_708 = 0;
      local_700 = '\0';
      plVar10 = local_610;
      if (local_608 != 0 && local_6e8 != 0) {
        lVar13 = 0;
        do {
          if (local_6f0[lVar13] != *(char *)((long)local_610 + lVar13)) goto LAB_00109aba;
          lVar1 = lVar13 + 1;
        } while ((local_6e8 + -1 != lVar13) &&
                (bVar14 = local_608 - 1 != lVar13, lVar13 = lVar1, bVar14));
        plVar10 = (long *)((long)local_610 + lVar1);
      }
      if (plVar10 == (long *)((long)local_610 + local_608)) {
        std::__cxx11::string::find((char *)&local_6f0,0x11396f,local_608);
        bVar14 = false;
      }
      else {
LAB_00109aba:
        plVar10 = local_648;
        if (local_640 != 0 && local_6e8 != 0) {
          lVar13 = 0;
          do {
            if (local_6f0[lVar13] != *(char *)((long)local_648 + lVar13)) goto LAB_00109b1c;
            lVar1 = lVar13 + 1;
          } while ((local_6e8 + -1 != lVar13) &&
                  (bVar14 = local_640 - 1 != lVar13, lVar13 = lVar1, bVar14));
          plVar10 = (long *)(lVar1 + (long)local_648);
        }
        if (plVar10 == (long *)((long)local_648 + local_640)) {
          std::__cxx11::string::find((char *)&local_6f0,0x113971,local_640);
          bVar14 = true;
        }
        else {
LAB_00109b1c:
          bVar14 = false;
        }
      }
      std::__cxx11::string::substr((ulong)local_5c0,(ulong)&local_6f0);
      std::__cxx11::string::operator=((string *)&local_6a8,(string *)local_5c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ != &local_5b0) {
        operator_delete((void *)local_5c0._0_8_,local_5b0._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)local_5c0,(ulong)&local_6f0);
      std::__cxx11::string::operator=((string *)&local_710,(string *)local_5c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ != &local_5b0) {
        operator_delete((void *)local_5c0._0_8_,local_5b0._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)local_5c0,(ulong)&local_6f0);
      std::__cxx11::string::operator=((string *)&local_668,(string *)local_5c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._0_8_ != &local_5b0) {
        operator_delete((void *)local_5c0._0_8_,local_5b0._M_allocated_capacity + 1);
      }
      local_758.path._M_dataplus._M_p = (pointer)&local_758.path.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_758,local_6a8,local_6a8 + local_6a0);
      local_758.system = bVar14;
      fix_include(&local_628,&local_758,local_6d0,local_5d0,local_5c8,prefer_relative_to_root);
      pCVar3 = local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_6f0,local_6e8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        result->failed = result->failed + 1;
        if ((omit_system_failed & bVar14) == 0) {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,RED_abi_cxx11_._M_dataplus._M_p,
                              RED_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_15a60,0x23);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_710,local_708);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,CLEAR_abi_cxx11_._M_dataplus._M_p,
                              CLEAR_abi_cxx11_._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        }
      }
      else {
        std::filesystem::__cxx11::path::path
                  ((path *)local_5c0,
                   (path *)local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        local_598 = (pCVar3->search_path).system;
        local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
        pcVar2 = (pCVar3->header)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_590,pcVar2,pcVar2 + (pCVar3->header)._M_string_length);
        local_570._0_4_ = pCVar3->filename_distance;
        local_570._4_4_ = pCVar3->folder_distance;
        local_730 = &local_720;
        local_728 = 0;
        local_720 = '\0';
        if (bVar14 == false) {
LAB_00109dbc:
          if ((local_598 == '\x01') && (user_to_system != false)) goto LAB_00109ed5;
          if (bVar14 != false) goto LAB_00109dd8;
LAB_00109def:
          bVar11 = 0;
        }
        else {
          if (local_598 == '\0') {
            if (bVar14 == false) goto LAB_00109dbc;
LAB_00109dd8:
            if ((local_598 != '\0') || (user_to_system != false)) goto LAB_00109def;
          }
LAB_00109ed5:
          bVar11 = 1;
        }
        if (bVar11 == 0) {
          std::operator+(&local_688,"\"",&local_590);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_688);
        }
        else {
          std::operator+(&local_688,"<",&local_590);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_688);
        }
        plVar9 = plVar10 + 2;
        if ((long *)*plVar10 == plVar9) {
          local_6b8 = *plVar9;
          lStack_6b0 = plVar10[3];
          local_6c8 = &local_6b8;
        }
        else {
          local_6b8 = *plVar9;
          local_6c8 = (long *)*plVar10;
        }
        local_6c0 = plVar10[1];
        *plVar10 = (long)plVar9;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_730,(string *)&local_6c8);
        if (local_6c8 != &local_6b8) {
          operator_delete(local_6c8,local_6b8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688._M_dataplus._M_p != &local_688.field_2) {
          operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
        }
        if ((bVar11 ^ bVar14) == 1) {
          (&result->system_to_user)[bVar14 ^ 1] = (&result->system_to_user)[bVar14 ^ 1] + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_3b0,"#include ",9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_730,local_728);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_668,local_660);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if (local_590._M_string_length == local_6a0) {
          if (local_590._M_string_length != 0) {
            iVar4 = bcmp(local_590._M_dataplus._M_p,local_6a8,local_590._M_string_length);
            if (iVar4 != 0) goto LAB_0010a091;
          }
          if ((bVar11 ^ bVar14) != 0) {
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,BLUE_abi_cxx11_._M_dataplus._M_p,
                                BLUE_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_15a12,0x22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_710,local_708);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ->  ",6);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_730,local_728);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,CLEAR_abi_cxx11_._M_dataplus._M_p,
                                CLEAR_abi_cxx11_._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            goto LAB_0010a1b5;
          }
          result->untouched = result->untouched + 1;
          if (omit_untouched == false) {
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,GREEN_abi_cxx11_._M_dataplus._M_p,
                                GREEN_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_15a2c,0x1f);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_710,local_708);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,CLEAR_abi_cxx11_._M_dataplus._M_p,
                                CLEAR_abi_cxx11_._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            goto LAB_0010a1b5;
          }
        }
        else {
LAB_0010a091:
          result->replaced_path = result->replaced_path + 1;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,YELLOW_abi_cxx11_._M_dataplus._M_p,
                              YELLOW_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_159e2,0x23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_710,local_708);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ->  ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_730,local_728);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,DIM_abi_cxx11_._M_dataplus._M_p,
                              DIM_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  (distance: fn=",0x10);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)local_570);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; dir=",6);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_570._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") from ",7);
          pbVar7 = std::filesystem::__cxx11::operator<<(poVar5,(path *)local_5c0);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (pbVar7,CLEAR_abi_cxx11_._M_dataplus._M_p,
                              CLEAR_abi_cxx11_._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_0010a1b5:
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if (1 < (ulong)(((long)local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         0x2e8ba2e8ba2e8ba3)) {
            uVar12 = 1;
            lVar13 = 0x58;
            do {
              pCVar3 = local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>._M_impl.
                       super__Vector_impl_data._M_start;
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,DIM_abi_cxx11_._M_dataplus._M_p,
                                  DIM_abi_cxx11_._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"           - Alternative: ",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,*(char **)((long)&(pCVar3->header)._M_dataplus._M_p + lVar13),
                         *(long *)((long)&(pCVar3->header)._M_string_length + lVar13));
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,DIM_abi_cxx11_._M_dataplus._M_p,
                                  DIM_abi_cxx11_._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  (distance: fn=",0x10);
              poVar5 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar5,
                                  *(int *)((long)&pCVar3->filename_distance + lVar13));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; dir=",6);
              poVar5 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar5,
                                  *(int *)((long)&pCVar3->folder_distance + lVar13));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,") from ",7);
              pbVar7 = std::filesystem::__cxx11::operator<<
                                 (poVar5,(path *)((long)&(pCVar3->search_path).path._M_pathname.
                                                         _M_dataplus._M_p + lVar13));
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (pbVar7,CLEAR_abi_cxx11_._M_dataplus._M_p,
                                  CLEAR_abi_cxx11_._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              uVar12 = uVar12 + 1;
              uVar8 = ((long)local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_628.super__Vector_base<Candidate,_std::allocator<Candidate>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
              lVar13 = lVar13 + 0x58;
            } while (uVar12 <= uVar8 && uVar8 - uVar12 != 0);
          }
        }
        if (local_730 != &local_720) {
          operator_delete(local_730,CONCAT71(uStack_71f,local_720) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_590._M_dataplus._M_p != &local_590.field_2) {
          operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path((path *)local_5c0);
      }
      std::vector<Candidate,_std::allocator<Candidate>_>::~vector(&local_628);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_758.path._M_dataplus._M_p != &local_758.path.field_2) {
        operator_delete(local_758.path._M_dataplus._M_p,
                        local_758.path.field_2._M_allocated_capacity + 1);
      }
      if (local_710 != &local_700) {
        operator_delete(local_710,CONCAT71(uStack_6ff,local_700) + 1);
      }
      if (local_668 != &local_658) {
        operator_delete(local_668,CONCAT71(uStack_657,local_658) + 1);
      }
      if (local_6a8 != &local_698) {
        operator_delete(local_6a8,CONCAT71(uStack_697,local_698) + 1);
      }
    }
    else {
LAB_001099b6:
      plVar10 = local_648;
      if (local_640 != 0 && local_6e8 != 0) {
        lVar13 = 0;
        do {
          if (local_6f0[lVar13] != *(char *)((long)local_648 + lVar13)) goto LAB_00109b2b;
          lVar1 = lVar13 + 1;
        } while ((local_6e8 + -1 != lVar13) &&
                (bVar14 = local_640 - 1 != lVar13, lVar13 = lVar1, bVar14));
        plVar10 = (long *)(lVar1 + (long)local_648);
      }
      if ((plVar10 == (long *)((long)local_648 + local_640)) && (process_system_includes == true))
      goto LAB_00109a24;
LAB_00109b2b:
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_6f0,local_6e8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (local_610 != local_600) {
      operator_delete(local_610,local_600[0] + 1);
    }
    if (local_648 != local_638) {
      operator_delete(local_648,local_638[0] + 1);
    }
    if (local_5f0[0] != local_5e0) {
      operator_delete(local_5f0[0],local_5e0[0] + 1);
    }
  } while( true );
}

Assistant:

void process_file(fs::path file, const std::vector<IncludePath> &include_paths,
                  const std::map<IncludePath, std::vector<fs::path>> &headers,
                  ProcessResult *result) {
  std::cout << "    Process " << file.string() << " ..." << std::endl;
  std::stringstream buffer;
  std::ifstream in(file.string());
  std::string line;
  while (std::getline(in, line, '\n')) {
    std::string prefix_all = "#include ";
    std::string prefix_system = "#include <";
    std::string prefix_user = "#include \"";
    if (boost::starts_with(line, prefix_user) ||
        (boost::starts_with(line, prefix_system) && process_system_includes)) {
      (result->total)++;

      std::string path, behind_path, path_with_quotes;
      size_t endPathPos = 0;
      bool system = false;
      if (boost::starts_with(line, prefix_user)) {
        endPathPos = line.find("\"", prefix_user.size());
        system = false;
      } else if (boost::starts_with(line, prefix_system)) {
        endPathPos = line.find(">", prefix_system.size());
        system = true;
      }

      path = line.substr(prefix_user.size(), endPathPos - prefix_user.size());
      path_with_quotes =
          line.substr(prefix_all.size(), endPathPos - prefix_all.size() + 1);
      behind_path = line.substr(endPathPos + 1);

      IncludeStmt current{path, system};
      std::vector<Candidate> candidate_fixes = fix_include(
          current, file, include_paths, headers, prefer_relative_to_root);

      if (!candidate_fixes.empty()) {
        Candidate fix = candidate_fixes[0];
        std::string fixed_path_with_quotes;
        bool emit_system_include = false;
        if ((system && fix.search_path.system) || // already good
            (!system && fix.search_path.system &&
             user_to_system) || // changed to system
            (system && !fix.search_path.system &&
             !user_to_system)) { // can't touch
          emit_system_include = true;
        }

        if (emit_system_include) {
          fixed_path_with_quotes = "<" + fix.header + ">";
        } else {
          fixed_path_with_quotes = "\"" + fix.header + "\"";
        }

        bool changed_include_type = system != emit_system_include;
        if (changed_include_type) {
          if (system) {
            result->system_to_user++;
          } else {
            result->user_to_system++;
          }
        }

        buffer << "#include " << fixed_path_with_quotes << behind_path
               << std::endl;
        if (fix.header != path) {
          (result->replaced_path)++;

          std::cout << YELLOW
                    << "        👕 Replace include path: " << path_with_quotes;
          std::cout << "  ->  " << fixed_path_with_quotes;
          std::cout << DIM << "  (distance: fn=" << fix.filename_distance
                    << "; dir=" << fix.folder_distance << ") from "
                    << fix.search_path.path << CLEAR << std::endl;
        } else if (changed_include_type) {
          std::cout << BLUE
                    << "        💄 Change include type: " << path_with_quotes;
          std::cout << "  ->  " << fixed_path_with_quotes << CLEAR << std::endl;
        } else {
          (result->untouched)++;

          if (omit_untouched) {
            continue; // the line is written.
          }
          std::cout << GREEN
                    << "        ✅ Untouched include: " << path_with_quotes
                    << CLEAR << std::endl;
        }

        for (int alt_idx = 1; alt_idx < candidate_fixes.size(); ++alt_idx) {
          Candidate &alt = candidate_fixes[alt_idx];
          std::cout << DIM << "           - Alternative: " << alt.header;
          std::cout << DIM << "  (distance: fn=" << alt.filename_distance
                    << "; dir=" << alt.folder_distance << ") from "
                    << alt.search_path.path << CLEAR << std::endl;
        }

      } else {
        buffer << line << std::endl;
        (result->failed)++;

        if (omit_system_failed && system) {
          continue; // the line is written.
        }
        std::cout << RED
                  << "        ❓ Failed to fix include: " << path_with_quotes
                  << CLEAR << std::endl;
      }
    } else {
      buffer << line << std::endl;
    }
  }
  in.close();

  if (!dry_run) {
    std::ofstream out(file.string());
    out << buffer.str();
    out.close();
  }
}